

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_core.c
# Opt level: O0

void grasshopper_set_decrypt_key(grasshopper_round_keys_t *subkeys,grasshopper_key_t *key)

{
  grasshopper_w128_t *in_RSI;
  int i;
  grasshopper_key_t *in_stack_00000028;
  grasshopper_round_keys_t *in_stack_00000030;
  undefined4 local_14;
  
  grasshopper_set_encrypt_key(in_stack_00000030,in_stack_00000028);
  for (local_14 = 1; local_14 < 10; local_14 = local_14 + 1) {
    grasshopper_l_inv(in_RSI);
  }
  return;
}

Assistant:

void grasshopper_set_decrypt_key(grasshopper_round_keys_t* subkeys, const grasshopper_key_t* key) {
		int i;
    grasshopper_set_encrypt_key(subkeys, key);

    for (i = 1; i < 10; i++) {
        grasshopper_l_inv(&subkeys->k[i]);
    }
}